

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_1d643::test_traits8_bit(void)

{
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  int local_2c;
  int local_28;
  int i_1;
  int i;
  default_traits<unsigned_char,_unsigned_char> traits1;
  
  charls::default_traits<unsigned_char,_unsigned_char>::default_traits
            ((default_traits<unsigned_char,_unsigned_char> *)&i_1,0xff,0,0x40);
  assert::is_true(traits1.quantized_bits_per_pixel == 0x20);
  assert::is_true(i_1 == 0xff);
  assert::is_true(traits1.bits_per_pixel == 0x40);
  assert::is_true(traits1.range == 8);
  assert::is_true(traits1.near_lossless == 8);
  for (local_28 = -0xff; local_28 != 0xff; local_28 = local_28 + 1) {
    iVar3 = charls::default_traits<unsigned_char,_unsigned_char>::modulo_range
                      ((default_traits<unsigned_char,_unsigned_char> *)&i_1,local_28);
    iVar4 = charls::lossless_traits_impl<unsigned_char,_8>::modulo_range(local_28);
    assert::is_true(iVar3 == iVar4);
    iVar3 = charls::default_traits<unsigned_char,_unsigned_char>::compute_error_value
                      ((default_traits<unsigned_char,_unsigned_char> *)&i_1,local_28);
    iVar4 = charls::lossless_traits<unsigned_char,_8>::compute_error_value(local_28);
    assert::is_true(iVar3 == iVar4);
  }
  for (local_2c = -0xff; local_2c != 0x200; local_2c = local_2c + 1) {
    iVar3 = charls::default_traits<unsigned_char,_unsigned_char>::correct_prediction
                      ((default_traits<unsigned_char,_unsigned_char> *)&i_1,local_2c);
    iVar4 = charls::lossless_traits_impl<unsigned_char,_8>::correct_prediction(local_2c);
    assert::is_true(iVar3 == iVar4);
    bVar1 = charls::default_traits<unsigned_char,_unsigned_char>::is_near
                      ((default_traits<unsigned_char,_unsigned_char> *)&i_1,local_2c,2);
    bVar2 = charls::lossless_traits_impl<unsigned_char,_8>::is_near(local_2c,2);
    assert::is_true(bVar1 == bVar2);
  }
  return;
}

Assistant:

void test_traits8_bit()
{
    const auto traits1{default_traits<uint8_t, uint8_t>(255, 0)};
    using lossless_traits = lossless_traits<uint8_t, 8>;

    assert::is_true(traits1.limit == lossless_traits::limit);
    assert::is_true(traits1.maximum_sample_value == lossless_traits::maximum_sample_value);
    assert::is_true(traits1.reset_threshold == lossless_traits::reset_threshold);
    assert::is_true(traits1.bits_per_pixel == lossless_traits::bits_per_pixel);
    assert::is_true(traits1.quantized_bits_per_pixel == lossless_traits::quantized_bits_per_pixel);

    for (int i{-255}; i != 255; ++i)
    {
        assert::is_true(traits1.modulo_range(i) == lossless_traits::modulo_range(i));
        assert::is_true(traits1.compute_error_value(i) == lossless_traits::compute_error_value(i));
    }

    for (int i{-255}; i != 512; ++i)
    {
        assert::is_true(traits1.correct_prediction(i) == lossless_traits::correct_prediction(i));
        assert::is_true(traits1.is_near(i, 2) == lossless_traits::is_near(i, 2));
    }
}